

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGParseGrammarContent(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  xmlChar *pxVar1;
  int iVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlRelaxNGDefinePtr_conflict payload;
  xmlRelaxNGDefinePtr_conflict pxVar5;
  xmlNodePtr pxVar6;
  xmlHashTablePtr hash;
  void *pvVar7;
  void *pvVar8;
  xmlNs *pxVar9;
  char *pcVar10;
  uint uVar11;
  bool bVar12;
  
  if (nodes == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x40d,"grammar has no children\n",(xmlChar *)0x0,(xmlChar *)0x0)
    ;
    uVar3 = 0xffffffff;
  }
  else {
    uVar11 = 0;
    do {
      if ((nodes->ns == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) {
LAB_0018808f:
        pxVar4 = nodes->name;
        iVar2 = 0x40c;
        pcVar10 = "grammar has unexpected child %s\n";
LAB_001880a1:
        xmlRngPErr(ctxt,nodes,iVar2,pcVar10,pxVar4,(xmlChar *)0x0);
        uVar3 = 0xffffffff;
      }
      else {
        iVar2 = xmlStrEqual(nodes->name,(xmlChar *)"start");
        pxVar9 = nodes->ns;
        uVar3 = uVar11;
        if (iVar2 != 0) {
          iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
          if (iVar2 == 0) {
            pxVar9 = nodes->ns;
            goto LAB_00187ee6;
          }
          if (nodes->children == (xmlNodePtr)0x0) {
            xmlRngPErr(ctxt,nodes,0x452,"start has no children\n",(xmlChar *)0x0,(xmlChar *)0x0);
          }
          else {
            iVar2 = xmlRelaxNGParseStart(ctxt,nodes->children);
            uVar3 = -(uint)(iVar2 != 0) | uVar11;
          }
          goto LAB_001880ae;
        }
LAB_00187ee6:
        if ((pxVar9 == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) goto LAB_0018808f;
        iVar2 = xmlStrEqual(nodes->name,"define");
        pxVar9 = nodes->ns;
        if (iVar2 == 0) {
LAB_00187ff3:
          if ((((pxVar9 == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) ||
              (iVar2 = xmlStrEqual(nodes->name,(xmlChar *)"include"), iVar2 == 0)) ||
             (iVar2 = xmlStrEqual(nodes->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
             iVar2 == 0)) goto LAB_0018808f;
          if (nodes->psvi == (void *)0x0) {
            iVar2 = 0x412;
            pcVar10 = "Include node has no data\n";
            pxVar4 = (xmlChar *)0x0;
            goto LAB_001880a1;
          }
          pxVar6 = xmlDocGetRootElement(*(xmlDoc **)((long)nodes->psvi + 0x10));
          if (pxVar6 == (xmlNodePtr)0x0) {
            iVar2 = 0x3fe;
            pcVar10 = "Include document is empty\n";
          }
          else {
            iVar2 = xmlStrEqual(pxVar6->name,"grammar");
            if (iVar2 != 0) {
              if (pxVar6->children == (xmlNodePtr)0x0) {
                bVar12 = true;
              }
              else {
                iVar2 = xmlRelaxNGParseGrammarContent(ctxt,pxVar6->children);
                bVar12 = iVar2 == 0;
              }
              if (nodes->children != (xmlNodePtr)0x0) {
                iVar2 = xmlRelaxNGParseGrammarContent(ctxt,nodes->children);
                uVar3 = 0xffffffff;
                if (iVar2 != 0) goto LAB_001880ae;
              }
              uVar3 = uVar11;
              if (!bVar12) {
                uVar3 = 0xffffffff;
              }
              goto LAB_001880ae;
            }
            iVar2 = 0x40e;
            pcVar10 = "Include document root is not a grammar\n";
          }
          xmlRngPErr(ctxt,nodes,iVar2,pcVar10,(xmlChar *)0x0,(xmlChar *)0x0);
          uVar3 = 0xffffffff;
        }
        else {
          iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
          if (iVar2 == 0) {
            pxVar9 = nodes->ns;
            goto LAB_00187ff3;
          }
          pxVar4 = xmlGetProp(nodes,"name");
          if (pxVar4 == (xmlChar *)0x0) {
            xmlRngPErr(ctxt,nodes,0x3f6,"define has no name\n",(xmlChar *)0x0,(xmlChar *)0x0);
            goto LAB_001880ae;
          }
          xmlRelaxNGNormExtSpace(pxVar4);
          iVar2 = xmlValidateNCName(pxVar4,0);
          if (iVar2 != 0) {
            xmlRngPErr(ctxt,nodes,0x419,"define name \'%s\' is not an NCName\n",pxVar4,
                       (xmlChar *)0x0);
          }
          payload = xmlRelaxNGNewDefine(ctxt,nodes);
          if (payload == (xmlRelaxNGDefinePtr_conflict)0x0) {
            (*xmlFree)(pxVar4);
LAB_001881c8:
            uVar3 = 0xffffffff;
          }
          else {
            payload->type = XML_RELAXNG_DEF;
            payload->name = pxVar4;
            pxVar6 = nodes->children;
            if (pxVar6 == (xmlNodePtr)0x0) {
              xmlRngPErr(ctxt,nodes,0x3f4,"define has no children\n",(xmlChar *)0x0,(xmlChar *)0x0);
            }
            else {
              pxVar1 = ctxt->define;
              ctxt->define = pxVar4;
              pxVar5 = xmlRelaxNGParsePatterns(ctxt,pxVar6,0);
              payload->content = pxVar5;
              ctxt->define = pxVar1;
            }
            hash = ctxt->grammar->defs;
            if (hash == (xmlHashTablePtr)0x0) {
              hash = xmlHashCreate(10);
              ctxt->grammar->defs = hash;
              if (hash != (xmlHashTablePtr)0x0) goto LAB_00188141;
              pcVar10 = "Could not create definition hash\n";
              pxVar4 = (xmlChar *)0x0;
LAB_001881c0:
              xmlRngPErr(ctxt,nodes,0x3f3,pcVar10,pxVar4,(xmlChar *)0x0);
              goto LAB_001881c8;
            }
LAB_00188141:
            iVar2 = xmlHashAddEntry(hash,pxVar4,payload);
            if (iVar2 < 0) {
              pvVar7 = xmlHashLookup(ctxt->grammar->defs,pxVar4);
              if (pvVar7 == (void *)0x0) {
                pcVar10 = "Internal error on define aggregation of %s\n";
                goto LAB_001881c0;
              }
              do {
                pvVar8 = pvVar7;
                pvVar7 = *(void **)((long)pvVar8 + 0x58);
              } while (pvVar7 != (void *)0x0);
              *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar8 + 0x58) = payload;
            }
          }
        }
      }
LAB_001880ae:
      nodes = nodes->next;
      uVar11 = uVar3;
    } while (nodes != (_xmlNode *)0x0);
  }
  return uVar3;
}

Assistant:

static int
xmlRelaxNGParseGrammarContent(xmlRelaxNGParserCtxtPtr ctxt,
                              xmlNodePtr nodes)
{
    int ret = 0, tmp;

    if (nodes == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_EMPTY,
                   "grammar has no children\n", NULL, NULL);
        return (-1);
    }
    while (nodes != NULL) {
        if (IS_RELAXNG(nodes, "start")) {
            if (nodes->children == NULL) {
                xmlRngPErr(ctxt, nodes, XML_RNGP_START_EMPTY,
                           "start has no children\n", NULL, NULL);
            } else {
                tmp = xmlRelaxNGParseStart(ctxt, nodes->children);
                if (tmp != 0)
                    ret = -1;
            }
        } else if (IS_RELAXNG(nodes, "define")) {
            tmp = xmlRelaxNGParseDefine(ctxt, nodes);
            if (tmp != 0)
                ret = -1;
        } else if (IS_RELAXNG(nodes, "include")) {
            tmp = xmlRelaxNGParseInclude(ctxt, nodes);
            if (tmp != 0)
                ret = -1;
        } else {
            xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_CONTENT,
                       "grammar has unexpected child %s\n", nodes->name,
                       NULL);
            ret = -1;
        }
        nodes = nodes->next;
    }
    return (ret);
}